

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapePrism>::FirstShapeIndex(TPZVec<long> *Index,int *scalarorders)

{
  int iVar1;
  long *plVar2;
  TPZVec<long> *in_RDI;
  int temp;
  int sideorder;
  int iside;
  int in_stack_ffffffffffffffcc;
  int side;
  int local_14;
  
  plVar2 = TPZVec<long>::operator[](in_RDI,0);
  *plVar2 = 0;
  for (local_14 = 0; local_14 < 0x15; local_14 = local_14 + 1) {
    plVar2 = TPZVec<long>::operator[](in_RDI,(long)local_14);
    side = (int)*plVar2;
    iVar1 = pzshape::TPZShapePrism::NConnectShapeF(side,in_stack_ffffffffffffffcc);
    plVar2 = TPZVec<long>::operator[](in_RDI,(long)(local_14 + 1));
    *plVar2 = (long)(side + iVar1);
  }
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::FirstShapeIndex(TPZVec<int64_t> &Index, int &scalarorders) {
    Index[0] = 0;

    for(int iside=0;iside<TSHAPE::NSides;iside++)
    {
        int sideorder = 1;
        if (iside >= TSHAPE::NCornerNodes) {
            sideorder = scalarorders;
        }
        int temp = Index[iside] + TSHAPE::NConnectShapeF(iside,sideorder);
        Index[iside+1] = temp;
    }
}